

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUser.cpp
# Opt level: O0

string * __thiscall BaseUser::getFullName_abi_cxx11_(string *__return_storage_ptr__,BaseUser *this)

{
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  BaseUser *local_18;
  BaseUser *this_local;
  
  local_18 = this;
  this_local = (BaseUser *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_58,&(this->super_Model<BaseUser>).field_0xc,&local_59);
  std::operator+(&local_38,&local_58," ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,this->lastName,&local_91);
  std::operator+(__return_storage_ptr__,&local_38,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return __return_storage_ptr__;
}

Assistant:

string BaseUser::getFullName() const {
    return string(firstName) + " " + string(lastName);
}